

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

SurfaceInteraction *
pbrt::BilinearPatch::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,BilinearPatchMesh *mesh,int patchIndex,
          Point2f uv,Float time,Vector3f *wo)

{
  float fVar1;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar16;
  ulong uVar11;
  undefined4 uVar17;
  Point2f PVar12;
  ulong uVar13;
  undefined4 uVar18;
  undefined4 uVar19;
  ulong uVar14;
  ulong uVar15;
  bool bVar20;
  int iVar21;
  int iVar22;
  int *piVar23;
  Point3f *pPVar24;
  Point2f *pPVar25;
  Normal3f *pNVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ulong uVar30;
  undefined8 uVar31;
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  Normal3f dndvs;
  int iVar32;
  bool bVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  Vector3f dpdu;
  Vector3f dpdv;
  Vector3f axis;
  Vector3f dpdus;
  Normal3f ns;
  Vector3f dpdvs;
  Normal3f dndus;
  float va;
  undefined4 uStack_22c;
  float local_228;
  float local_220;
  float local_21c;
  undefined8 local_218;
  float local_210;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  long local_170;
  Tuple3<pbrt::Vector3,_float> local_168;
  Tuple3<pbrt::Point3,_float> local_158;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  double vb;
  float local_c0;
  Float local_b8;
  float local_b4;
  Float local_b0;
  Float local_a8;
  float local_a4;
  Float local_a0;
  Point3fi local_48;
  float fVar2;
  float fVar3;
  float fVar4;
  
  auVar60._8_56_ = in_register_00001208;
  auVar60._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  piVar23 = mesh->vertexIndices;
  pPVar24 = mesh->p;
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = 0x3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  local_188 = auVar60._0_16_;
  auVar51 = vshufps_avx(local_188,local_188,0xe1);
  local_1a8 = vbroadcastss_avx512vl(local_188);
  _local_e8 = vmovshdup_avx512vl(local_188);
  local_170 = (long)(patchIndex * 4);
  iVar32 = piVar23[local_170 + 2];
  iVar21 = piVar23[local_170 + 3];
  _local_148 = vsubps_avx512vl(auVar44,local_188);
  iVar22 = piVar23[local_170 + 1];
  uVar7 = pPVar24[iVar32].super_Tuple3<pbrt::Point3,_float>.x;
  uVar16 = pPVar24[iVar32].super_Tuple3<pbrt::Point3,_float>.y;
  auVar63._4_4_ = uVar16;
  auVar63._0_4_ = uVar7;
  auVar63._8_8_ = 0;
  uVar30._0_4_ = pPVar24[piVar23[local_170]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar30._4_4_ = pPVar24[piVar23[local_170]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar30;
  uVar11._0_4_ = pPVar24[iVar21].super_Tuple3<pbrt::Point3,_float>.x;
  uVar11._4_4_ = pPVar24[iVar21].super_Tuple3<pbrt::Point3,_float>.y;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar11;
  auVar35 = vshufps_avx512vl(_local_148,_local_148,0xe1);
  auVar36 = vbroadcastss_avx512vl
                      (ZEXT416((uint)pPVar24[piVar23[local_170]].super_Tuple3<pbrt::Point3,_float>.z
                              ));
  fVar57 = pPVar24[iVar32].super_Tuple3<pbrt::Point3,_float>.z;
  local_198 = vbroadcastss_avx512vl(_local_148);
  fVar5 = pPVar24[iVar21].super_Tuple3<pbrt::Point3,_float>.z;
  auVar55._4_4_ = fVar5;
  auVar55._0_4_ = fVar5;
  auVar55._8_4_ = fVar5;
  auVar55._12_4_ = fVar5;
  uVar8 = pPVar24[iVar22].super_Tuple3<pbrt::Point3,_float>.x;
  uVar17 = pPVar24[iVar22].super_Tuple3<pbrt::Point3,_float>.y;
  auVar54._4_4_ = uVar17;
  auVar54._0_4_ = uVar8;
  auVar54._8_8_ = 0;
  fVar6 = pPVar24[iVar22].super_Tuple3<pbrt::Point3,_float>.z;
  auVar39 = vinsertps_avx(auVar54,auVar63,0x50);
  auVar38 = vinsertps_avx(auVar63,auVar54,0x50);
  fVar34 = uv.super_Tuple2<pbrt::Point2,_float>.x;
  fVar27 = uv.super_Tuple2<pbrt::Point2,_float>.y;
  fVar28 = in_register_00001208._0_4_;
  fVar29 = in_register_00001208._4_4_;
  auVar41._0_4_ = auVar35._0_4_ * (float)(undefined4)uVar30 + auVar38._0_4_ * auVar51._0_4_;
  auVar41._4_4_ = auVar35._4_4_ * (float)uVar30._4_4_ + auVar38._4_4_ * auVar51._4_4_;
  auVar41._8_4_ = auVar35._8_4_ * 0.0 + auVar38._8_4_ * auVar51._8_4_;
  auVar41._12_4_ = auVar35._12_4_ * 0.0 + auVar38._12_4_ * auVar51._12_4_;
  auVar37 = vmulps_avx512vl(_local_148,auVar56);
  auVar40._0_4_ = auVar35._0_4_ * auVar39._0_4_ + auVar51._0_4_ * (float)(undefined4)uVar11;
  auVar40._4_4_ = auVar35._4_4_ * auVar39._4_4_ + auVar51._4_4_ * (float)uVar11._4_4_;
  auVar40._8_4_ = auVar35._8_4_ * auVar39._8_4_ + auVar51._8_4_ * 0.0;
  auVar40._12_4_ = auVar35._12_4_ * auVar39._12_4_ + auVar51._12_4_ * 0.0;
  auVar38 = vmulps_avx512vl(_local_148,auVar38);
  auVar51._0_4_ = auVar38._0_4_ + (float)(undefined4)uVar11 * fVar34;
  auVar51._4_4_ = auVar38._4_4_ + (float)uVar11._4_4_ * fVar27;
  auVar51._8_4_ = auVar38._8_4_ + fVar28 * 0.0;
  auVar51._12_4_ = auVar38._12_4_ + fVar29 * 0.0;
  auVar35._0_4_ = auVar37._0_4_ + auVar39._0_4_ * fVar34;
  auVar35._4_4_ = auVar37._4_4_ + auVar39._4_4_ * fVar27;
  auVar35._8_4_ = auVar37._8_4_ + auVar39._8_4_ * fVar28;
  auVar35._12_4_ = auVar37._12_4_ + auVar39._12_4_ * fVar29;
  auVar39 = vblendps_avx(auVar40,auVar51,2);
  auVar38 = vblendps_avx(auVar41,auVar35,2);
  auVar51 = vsubps_avx(auVar51,auVar35);
  auVar35 = vmulps_avx512vl(_local_148,auVar36);
  auVar38 = vmulps_avx512vl(local_198,auVar38);
  auVar39 = vmulps_avx512vl(local_1a8,auVar39);
  auVar43._0_4_ = auVar38._0_4_ + auVar39._0_4_;
  auVar43._4_4_ = auVar38._4_4_ + auVar39._4_4_;
  auVar43._8_4_ = auVar38._8_4_ + auVar39._8_4_;
  auVar43._12_4_ = auVar38._12_4_ + auVar39._12_4_;
  local_158._0_8_ = vmovlps_avx(auVar43);
  auVar38 = vsubps_avx(auVar40,auVar41);
  auVar39 = vinsertps_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar57),0x10);
  local_1e8 = vblendps_avx(auVar38,auVar51,2);
  auVar42._0_4_ = auVar35._0_4_ + auVar39._0_4_ * fVar34;
  auVar42._4_4_ = auVar35._4_4_ + auVar39._4_4_ * fVar27;
  auVar42._8_4_ = auVar35._8_4_ + auVar39._8_4_ * fVar28;
  auVar42._12_4_ = auVar35._12_4_ + auVar39._12_4_ * fVar29;
  auVar39 = vinsertps_avx512f(ZEXT416((uint)fVar57),ZEXT416((uint)fVar6),0x10);
  auVar39 = vmulps_avx512vl(_local_148,auVar39);
  auVar37._0_4_ = auVar39._0_4_ + fVar5 * fVar34;
  auVar37._4_4_ = auVar39._4_4_ + fVar5 * fVar27;
  auVar37._8_4_ = auVar39._8_4_ + fVar5 * fVar28;
  auVar37._12_4_ = auVar39._12_4_ + fVar5 * fVar29;
  auVar39 = vmovshdup_avx(auVar42);
  auVar35 = vmulss_avx512f(_local_148,auVar39);
  _local_f8 = vmovshdup_avx512vl(_local_148);
  auVar39 = vmovshdup_avx(auVar37);
  local_128 = vsubps_avx512vl(auVar37,auVar42);
  local_1f8 = vblendps_avx(auVar51,auVar38,2);
  local_138 = vmovshdup_avx512vl(local_128);
  local_158.z = auVar35._0_4_ + auVar39._0_4_ * fVar34;
  pPVar25 = mesh->uv;
  bVar33 = pPVar25 == (Point2f *)0x0;
  _local_208 = local_188;
  if (!bVar33) {
    auVar80._8_8_ = 0;
    auVar80._0_4_ = pPVar25[iVar32].super_Tuple2<pbrt::Point2,_float>.x;
    auVar80._4_4_ = pPVar25[iVar32].super_Tuple2<pbrt::Point2,_float>.y;
    auVar85._8_8_ = 0;
    auVar85._0_4_ = pPVar25[iVar22].super_Tuple2<pbrt::Point2,_float>.x;
    auVar85._4_4_ = pPVar25[iVar22].super_Tuple2<pbrt::Point2,_float>.y;
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    PVar12.super_Tuple2<pbrt::Point2,_float> =
         pPVar25[piVar23[local_170]].super_Tuple2<pbrt::Point2,_float>;
    auVar49._8_8_ = 0;
    auVar49._0_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.x;
    auVar49._4_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.y;
    auVar39 = vmulps_avx512vl(_local_e8,auVar80);
    auVar35 = vmulps_avx512vl(_local_f8,auVar49);
    auVar47._0_4_ = auVar35._0_4_ + auVar39._0_4_;
    auVar47._4_4_ = auVar35._4_4_ + auVar39._4_4_;
    auVar47._8_4_ = auVar35._8_4_ + auVar39._8_4_;
    auVar47._12_4_ = auVar35._12_4_ + auVar39._12_4_;
    auVar39 = vmulps_avx512vl(_local_f8,auVar85);
    auVar35 = vmulps_avx512vl(local_198,auVar47);
    auVar87._8_8_ = 0;
    auVar87._0_4_ = pPVar25[iVar21].super_Tuple2<pbrt::Point2,_float>.x;
    auVar87._4_4_ = pPVar25[iVar21].super_Tuple2<pbrt::Point2,_float>.y;
    auVar37 = vmulps_avx512vl(_local_e8,auVar87);
    auVar39 = vaddps_avx512vl(auVar39,auVar37);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x322bcc77));
    auVar39 = vmulps_avx512vl(local_1a8,auVar39);
    auVar37 = vmovshdup_avx(auVar49);
    local_208._4_4_ = auVar35._4_4_ + auVar39._4_4_;
    local_208._0_4_ = auVar35._0_4_ + auVar39._0_4_;
    fStack_200 = auVar35._8_4_ + auVar39._8_4_;
    fStack_1fc = auVar35._12_4_ + auVar39._12_4_;
    auVar39 = vsubps_avx(auVar49,auVar80);
    auVar50._0_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.x;
    auVar50._4_4_ = auVar50._0_4_;
    auVar50._8_4_ = auVar50._0_4_;
    auVar50._12_4_ = auVar50._0_4_;
    auVar39 = vsubps_avx(auVar39,auVar85);
    auVar42 = vaddps_avx512vl(auVar39,auVar87);
    auVar39 = vinsertps_avx(auVar85,auVar80,0x4c);
    auVar35 = vinsertps_avx(auVar80,auVar85,0x1c);
    auVar39 = vsubps_avx(auVar39,auVar37);
    auVar35 = vsubps_avx(auVar35,auVar50);
    auVar37 = vmovshdup_avx512vl(auVar42);
    auVar42 = vbroadcastss_avx512vl(auVar42);
    auVar39 = vfmadd213ps_fma(auVar37,local_188,auVar39);
    auVar35 = vfmadd213ps_fma(auVar42,local_188,auVar35);
    auVar37 = vandps_avx512vl(auVar39,auVar40);
    auVar42 = vpermi2ps_avx512vl(_DAT_00447c60,local_128,auVar51);
    uVar30 = vcmpps_avx512vl(auVar37,auVar41,5);
    auVar37 = vandps_avx512vl(auVar35,auVar40);
    auVar39 = vdivps_avx512vl(auVar44,auVar39);
    fVar34 = (float)((uint)((byte)uVar30 & 1) * auVar39._0_4_);
    fVar27 = (float)((uint)((byte)(uVar30 >> 1) & 1) * auVar39._4_4_);
    auVar45._4_4_ = fVar27;
    auVar45._0_4_ = fVar34;
    fVar28 = (float)((uint)((byte)(uVar30 >> 2) & 1) * auVar39._8_4_);
    auVar45._8_4_ = fVar28;
    fVar29 = (float)((uint)((byte)(uVar30 >> 3) & 1) * auVar39._12_4_);
    auVar45._12_4_ = fVar29;
    uVar30 = vcmpps_avx512vl(auVar37,auVar41,5);
    auVar39 = vdivps_avx512vl(auVar44,auVar35);
    fVar1 = (float)((uint)((byte)uVar30 & 1) * auVar39._0_4_);
    fVar2 = (float)((uint)((byte)(uVar30 >> 1) & 1) * auVar39._4_4_);
    auVar46._4_4_ = fVar2;
    auVar46._0_4_ = fVar1;
    fVar3 = (float)((uint)((byte)(uVar30 >> 2) & 1) * auVar39._8_4_);
    auVar46._8_4_ = fVar3;
    fVar4 = (float)((uint)((byte)(uVar30 >> 3) & 1) * auVar39._12_4_);
    auVar46._12_4_ = fVar4;
    auVar39 = vshufps_avx512vl(auVar45,auVar45,0xe1);
    auVar48._0_4_ = auVar51._0_4_ * fVar34;
    auVar48._4_4_ = auVar51._4_4_ * fVar27;
    auVar48._8_4_ = auVar51._8_4_ * fVar28;
    auVar48._12_4_ = auVar51._12_4_ * fVar29;
    auVar37 = vmulps_avx512vl(local_128,auVar45);
    auVar40 = vmulps_avx512vl(auVar38,auVar39);
    auVar35 = vmovshdup_avx(auVar46);
    auVar39 = vhaddps_avx(auVar37,auVar37);
    auVar43 = vaddps_avx512vl(auVar48,auVar40);
    auVar76._0_4_ = auVar38._0_4_ * auVar35._0_4_ + auVar51._0_4_ * fVar1;
    auVar76._4_4_ = auVar38._4_4_ * auVar35._4_4_ + auVar51._4_4_ * fVar2;
    auVar76._8_4_ = auVar38._8_4_ * auVar35._8_4_ + auVar51._8_4_ * fVar3;
    auVar76._12_4_ = auVar38._12_4_ * auVar35._12_4_ + auVar51._12_4_ * fVar4;
    auVar44 = vmovshdup_avx512vl(auVar43);
    auVar37 = vinsertps_avx512f(auVar39,auVar43,0x10);
    auVar41 = vpermi2ps_avx512vl(_DAT_00447ca0,auVar38,local_128);
    auVar35 = vshufps_avx(auVar46,auVar46,0xe1);
    auVar40 = vinsertps_avx512f(auVar44,auVar39,0x1c);
    auVar81._0_4_ = auVar41._0_4_ * fVar1 + auVar42._0_4_ * auVar35._0_4_;
    auVar81._4_4_ = auVar41._4_4_ * fVar2 + auVar42._4_4_ * auVar35._4_4_;
    auVar81._8_4_ = auVar41._8_4_ * fVar3 + auVar42._8_4_ * auVar35._8_4_;
    auVar81._12_4_ = auVar41._12_4_ * fVar4 + auVar42._12_4_ * auVar35._12_4_;
    auVar35 = vmovshdup_avx(auVar81);
    auVar41 = vinsertps_avx512f(auVar35,auVar76,0x1c);
    auVar42 = vmulps_avx512vl(auVar41,auVar40);
    auVar37 = vfmsub213ps_avx512vl(auVar37,auVar81,auVar42);
    auVar40 = vfnmadd213ps_avx512vl(auVar40,auVar41,auVar42);
    auVar42 = vxorps_avx512vl(auVar42,auVar42);
    auVar40 = vaddps_avx512vl(auVar37,auVar40);
    auVar37 = ZEXT416((uint)(auVar81._0_4_ * auVar43._0_4_));
    auVar44 = vfmsub213ss_avx512f(auVar44,auVar76,auVar37);
    auVar37 = vfnmadd231ss_fma(auVar37,auVar81,auVar43);
    vaddss_avx512f(auVar44,auVar37);
    auVar37 = vucomiss_avx512f(auVar42);
    if ((bVar33) && ((POPCOUNT((ulong)pPVar25 & 0xff) & 1U) != 0)) {
      auVar42 = vxorps_avx512vl(auVar44,auVar44);
      uVar30 = vcmpps_avx512vl(auVar40,auVar42,4);
      bVar33 = (uVar30 & 1) == 0;
      if ((bVar33) && (bVar33 = (uVar30 >> 1 & 1) == 0, bVar33)) goto LAB_00223727;
    }
    auVar42 = vmovshdup_avx512vl(auVar38);
    auVar44 = vmulss_avx512f(auVar38,local_128);
    auVar45 = vmovshdup_avx512vl(auVar51);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar47 = vmulss_avx512f(auVar42,local_138);
    auVar48 = vfmsub213ss_avx512f(local_128,auVar45,auVar47);
    auVar47 = vfnmadd231ss_avx512f(auVar47,local_138,auVar42);
    auVar49 = vfmsub213ss_avx512f(local_138,auVar51,auVar44);
    auVar44 = vfnmadd231ss_avx512f(auVar44,auVar38,local_128);
    auVar50 = vmulss_avx512f(auVar51,auVar45);
    auVar38 = vfmsub213ss_avx512f(auVar42,auVar38,auVar50);
    auVar51 = vfnmadd213ss_avx512f(auVar51,auVar45,auVar50);
    auVar42 = vaddss_avx512f(auVar49,auVar44);
    auVar44 = vaddss_avx512f(auVar48,auVar47);
    auVar41 = vxorps_avx512vl(auVar41,auVar46);
    auVar45 = vxorps_avx512vl(auVar81,auVar46);
    auVar47 = vxorps_avx512vl(auVar39,auVar46);
    auVar51 = vaddss_avx512f(auVar38,auVar51);
    auVar38 = vmovshdup_avx512vl(auVar40);
    auVar38 = vmulss_avx512f(auVar42,auVar38);
    auVar38 = vfmadd231ss_avx512f(auVar38,auVar44,auVar40);
    auVar37 = vfmadd213ss_avx512f(auVar37,auVar51,auVar38);
    auVar38 = vucomiss_avx512f(auVar37);
    if (!bVar33) {
      auVar43 = vxorps_avx512vl(auVar43,auVar46);
    }
    auVar40 = vmovshdup_avx512vl(auVar43);
    uVar31 = vcmpss_avx512f(auVar37,auVar38,1);
    bVar33 = (bool)((byte)uVar31 & 1);
    auVar38 = vmulss_avx512f(auVar35,auVar40);
    vb = -0.001;
    local_128._4_12_ = auVar39._4_12_;
    local_128._0_4_ = (uint)bVar33 * auVar47._0_4_ + (uint)!bVar33 * auVar39._0_4_;
    auVar39 = vfmsub213ss_avx512f(local_128,auVar81,auVar38);
    auVar38 = vfmadd231ss_avx512f(auVar38,auVar41,auVar40);
    auVar37 = vmovshdup_avx512vl(auVar41);
    auVar41 = vaddss_avx512f(auVar39,auVar38);
    auVar39 = vmulss_avx512f(auVar76,local_128);
    auVar38 = vfmsub213ss_avx512f(auVar43,auVar35,auVar39);
    auVar39 = vfmadd213ss_avx512f(auVar37,local_128,auVar39);
    auVar39 = vaddss_avx512f(auVar38,auVar39);
    auVar38 = vmulss_avx512f(auVar81,auVar43);
    auVar37 = vfmsub213ss_avx512f(auVar40,auVar76,auVar38);
    auVar38 = vfmadd213ss_avx512f(auVar45,auVar43,auVar38);
    auVar39 = vinsertps_avx512f(auVar44,auVar39,0x10);
    auVar40 = vmulps_avx512vl(auVar39,auVar39);
    auVar37 = vaddss_avx512f(auVar37,auVar38);
    auVar38 = vinsertps_avx512f(auVar42,auVar41,0x10);
    auVar52._4_12_ = auVar39._4_12_;
    auVar52._0_4_ = auVar42._0_4_;
    auVar39 = vmulps_avx512vl(auVar38,auVar38);
    auVar38 = vaddps_avx512vl(auVar40,auVar39);
    auVar39 = vinsertps_avx512f(auVar51,auVar37,0x10);
    auVar39 = vmulps_avx512vl(auVar39,auVar39);
    auVar39 = vaddps_avx512vl(auVar39,auVar38);
    auVar39 = vsqrtps_avx512vl(auVar39);
    auVar38 = vdivps_avx512vl(auVar52,auVar39);
    auVar40 = vdivss_avx512f(auVar44,auVar39);
    auVar42 = vmovshdup_avx512vl(auVar39);
    auVar39 = vdivss_avx512f(auVar51,auVar39);
    auVar51 = vdivss_avx512f(auVar41,auVar42);
    auVar37 = vdivss_avx512f(auVar37,auVar42);
    auVar41 = vmovshdup_avx512vl(auVar38);
    auVar38 = vmulss_avx512f(auVar38,auVar41);
    auVar38 = vfmadd231ss_avx512f(auVar38,auVar40,auVar51);
    auVar39 = vfmadd231ss_avx512f(auVar38,auVar39,auVar37);
    _va = CONCAT44(uStack_22c,auVar39._0_4_);
    if (auVar39._0_4_ < -0.001) {
      LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.h"
                 ,0x589,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                 (char (*) [6])"-1e-3",
                 (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                 &va,(char (*) [6])"-1e-3",&vb);
    }
    local_1e8 = vinsertps_avx(auVar76,auVar81,0x1c);
    local_138 = auVar35;
    local_1f8 = auVar43;
  }
LAB_00223727:
  auVar39 = vsubps_avx(auVar56,auVar63);
  local_1c8._8_8_ = local_1c8._0_8_;
  local_1c8._0_8_ = wo;
  local_1b8._0_4_ = time;
  auVar39 = vsubps_avx(auVar39,auVar54);
  auVar74._0_4_ = auVar39._0_4_ + (float)(undefined4)uVar11;
  auVar74._4_4_ = auVar39._4_4_ + (float)uVar11._4_4_;
  auVar74._8_4_ = auVar39._8_4_ + 0.0;
  auVar74._12_4_ = auVar39._12_4_ + 0.0;
  auVar39 = vsubss_avx512f(auVar36,ZEXT416((uint)fVar57));
  auVar38 = vinsertps_avx512f(auVar36,ZEXT416((uint)fVar57),0x10);
  local_108 = vmovshdup_avx512vl(local_1f8);
  local_118 = vmovshdup_avx512vl(local_1e8);
  auVar51 = vmulss_avx512f(local_108,local_138);
  auVar35 = vmulss_avx512f(local_108,local_118);
  auVar36 = vmulss_avx512f(local_108,local_108);
  auVar37 = vsubss_avx512f(auVar39,ZEXT416((uint)fVar6));
  auVar39 = vmovshdup_avx(auVar74);
  auVar40 = vfmsub213ss_avx512f(local_128,local_118,auVar51);
  auVar51 = vfnmadd231ss_avx512f(auVar51,local_138,local_108);
  auVar41 = vmulss_avx512f(local_118,local_118);
  auVar35 = vfmadd231ss_avx512f(auVar35,local_1e8,local_1f8);
  auVar36 = vfmadd231ss_avx512f(auVar36,local_1f8,local_1f8);
  auVar41 = vfmadd231ss_avx512f(auVar41,local_1e8,local_1e8);
  fVar57 = auVar40._0_4_ + auVar51._0_4_;
  auVar51 = vmulss_avx512f(local_128,local_1e8);
  auVar35 = vfmadd231ss_avx512f(auVar35,local_138,local_128);
  auVar40 = vfmadd231ss_avx512f(auVar36,local_128,local_128);
  auVar36 = vfmsub213ss_avx512f(local_1f8,local_138,auVar51);
  auVar51 = vfnmadd231ss_avx512f(auVar51,local_1e8,local_128);
  auVar41 = vfmadd231ss_avx512f(auVar41,local_138,local_138);
  auVar51 = vaddss_avx512f(auVar36,auVar51);
  auVar36 = vmulss_avx512f(local_1f8,local_118);
  auVar42 = vfmsub213ss_avx512f(local_108,local_1e8,auVar36);
  auVar36 = vfnmadd231ss_avx512f(auVar36,local_118,local_1f8);
  auVar43 = vmulss_avx512f(auVar51,auVar51);
  auVar36 = vaddss_avx512f(auVar42,auVar36);
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57));
  auVar42 = vaddss_avx512f(auVar42,auVar43);
  auVar43 = vmulss_avx512f(auVar36,auVar36);
  auVar42 = vaddss_avx512f(auVar43,auVar42);
  auVar42 = vsqrtss_avx512f(auVar42,auVar42);
  auVar51 = vdivss_avx512f(auVar51,auVar42);
  auVar43 = vdivss_avx512f(ZEXT416((uint)fVar57),auVar42);
  auVar36 = vdivss_avx512f(auVar36,auVar42);
  auVar42 = vxorps_avx512vl(auVar42,auVar42);
  auVar44 = vmulss_avx512f(auVar51,auVar42);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * auVar51._0_4_)),auVar43,auVar74);
  auVar51 = vfmadd231ss_avx512f(auVar44,auVar43,auVar42);
  auVar37 = vfmadd231ss_avx512f(auVar39,auVar36,ZEXT416((uint)(auVar37._0_4_ + fVar5)));
  auVar43 = vfmadd231ss_avx512f(auVar51,auVar36,auVar42);
  auVar51 = vmulss_avx512f(auVar40,auVar43);
  auVar36 = ZEXT416((uint)(auVar35._0_4_ * auVar35._0_4_));
  auVar39 = vfmsub213ss_fma(auVar40,auVar41,auVar36);
  auVar36 = vfnmadd231ss_fma(auVar36,auVar35,auVar35);
  auVar44 = vmulss_avx512f(auVar41,auVar43);
  auVar51 = vfmsub231ss_fma(auVar51,auVar37,auVar35);
  auVar41 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar37._0_4_)),auVar43,auVar35);
  auVar40 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar37._0_4_)),auVar43,auVar35);
  auVar35 = vfmsub231ss_fma(auVar44,auVar35,auVar37);
  fVar57 = auVar39._0_4_ + auVar36._0_4_;
  uVar31 = vcmpss_avx512f(ZEXT416((uint)fVar57),auVar42,0);
  bVar33 = (bool)((byte)uVar31 & 1);
  fVar34 = (float)((uint)bVar33 * auVar42._0_4_ + (uint)!bVar33 * (int)(1.0 / fVar57));
  fVar57 = fVar34 * auVar51._0_4_;
  fVar5 = fVar34 * auVar35._0_4_;
  auVar36 = ZEXT416((uint)(fVar34 * auVar41._0_4_));
  auVar39 = vbroadcastss_avx512vl(auVar36);
  auVar51 = vmulss_avx512f(local_138,ZEXT416((uint)fVar57));
  auVar71._4_4_ = fVar57;
  auVar71._0_4_ = fVar57;
  auVar71._8_4_ = fVar57;
  auVar71._12_4_ = fVar57;
  auVar35 = vmulps_avx512vl(local_1e8,auVar71);
  auVar39 = vmulps_avx512vl(local_1f8,auVar39);
  local_1d8 = vaddps_avx512vl(auVar35,auVar39);
  auVar39 = vmulss_avx512f(local_128,auVar36);
  local_21c = auVar51._0_4_ + auVar39._0_4_;
  fVar34 = fVar34 * auVar40._0_4_;
  auVar70._4_4_ = fVar34;
  auVar70._0_4_ = fVar34;
  auVar70._8_4_ = fVar34;
  auVar70._12_4_ = fVar34;
  auVar39 = vmulss_avx512f(local_138,ZEXT416((uint)fVar34));
  auVar72._4_4_ = fVar5;
  auVar72._0_4_ = fVar5;
  auVar72._8_4_ = fVar5;
  auVar72._12_4_ = fVar5;
  auVar51 = vmulss_avx512f(local_128,ZEXT416((uint)fVar5));
  auVar35 = vmulps_avx512vl(local_1e8,auVar70);
  auVar36 = vmulps_avx512vl(local_1f8,auVar72);
  local_220 = auVar39._0_4_ + auVar51._0_4_;
  local_d8 = auVar35._0_4_ + auVar36._0_4_;
  fStack_d4 = auVar35._4_4_ + auVar36._4_4_;
  fStack_d0 = auVar35._8_4_ + auVar36._8_4_;
  fStack_cc = auVar35._12_4_ + auVar36._12_4_;
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  auVar39 = vandps_avx(auVar73,auVar38);
  auVar38 = vandps_avx(auVar73,auVar54);
  auVar37 = vinsertps_avx512f(ZEXT416((uint)fVar6),auVar55,0x10);
  auVar51 = vandps_avx(auVar73,auVar56);
  auVar35 = vandps_avx(auVar73,auVar63);
  auVar36 = vandps_avx(auVar73,auVar53);
  auVar37 = vandps_avx(auVar73,auVar37);
  auVar38 = vmaxps_avx(auVar38,auVar51);
  auVar51 = vmaxps_avx(auVar36,auVar35);
  auVar39 = vmaxps_avx(auVar37,auVar39);
  auVar38 = vmaxps_avx(auVar51,auVar38);
  auVar36._8_4_ = 0x34800002;
  auVar36._0_8_ = 0x3480000234800002;
  auVar36._12_4_ = 0x34800002;
  auVar51 = vmulps_avx512vl(auVar38,auVar36);
  auVar38 = vmovshdup_avx(auVar39);
  auVar39 = vmaxss_avx(auVar38,auVar39);
  local_168.z = auVar39._0_4_ * 2.3841864e-07;
  local_168._0_8_ = vmovlps_avx(auVar51);
  if (mesh->faceIndices == (int *)0x0) {
    iVar32 = 0;
  }
  else {
    iVar32 = mesh->faceIndices[patchIndex];
  }
  bVar33 = mesh->reverseOrientation;
  bVar20 = mesh->transformSwapsHandedness;
  Point3fi::Point3fi(&local_48,(Point3f *)&local_158,(Vector3f *)&local_168);
  auVar51 = local_1e8;
  auVar38 = local_1f8;
  auVar39._4_4_ = fStack_d4;
  auVar39._0_4_ = local_d8;
  auVar39._8_4_ = fStack_d0;
  auVar39._12_4_ = fStack_cc;
  vb = (double)vmovlps_avx(auVar39);
  local_c0 = local_220;
  _va = vmovlps_avx(local_1d8);
  local_228 = local_21c;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = local_21c;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)_va;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)_va >> 0x20);
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = local_220;
  dndv.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vb;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_138._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1e8._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1e8._4_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_128._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1f8._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1f8._4_4_;
  local_1f8 = auVar38;
  local_1e8 = auVar51;
  SurfaceInteraction::SurfaceInteraction
            (__return_storage_ptr__,pi,(Point2f)local_208,
             (Vector3f)*(Tuple3<pbrt::Vector3,_float> *)local_1c8._0_8_,dpdu,dpdv,dndu,dndv,
             (Float)local_1b8._0_4_,bVar33 != bVar20);
  __return_storage_ptr__->faceIndex = iVar32;
  pNVar26 = mesh->n;
  if (pNVar26 != (Normal3f *)0x0) {
    uVar13._0_4_ = pNVar26[piVar23[local_170]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar13._4_4_ = pNVar26[piVar23[local_170]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar13;
    uVar9 = pNVar26[piVar23[local_170 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar18 = pNVar26[piVar23[local_170 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar69._4_4_ = uVar18;
    auVar69._0_4_ = uVar9;
    auVar69._8_8_ = 0;
    uVar10 = pNVar26[piVar23[local_170 + 3]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar19 = pNVar26[piVar23[local_170 + 3]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar68._4_4_ = uVar19;
    auVar68._0_4_ = uVar10;
    auVar68._8_8_ = 0;
    uVar14._0_4_ = pNVar26[piVar23[local_170 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar14._4_4_ = pNVar26[piVar23[local_170 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar14;
    fVar57 = pNVar26[piVar23[local_170 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    auVar38 = vmulps_avx512vl(auVar69,local_188);
    auVar35 = vmulps_avx512vl(auVar68,local_188);
    auVar39 = vinsertps_avx(ZEXT416((uint)fVar57),auVar69,0x1c);
    auVar61._0_4_ = auVar38._0_4_ + (float)local_148._0_4_ * (float)(undefined4)uVar13;
    auVar61._4_4_ = auVar38._4_4_ + (float)local_148._4_4_ * (float)uVar13._4_4_;
    auVar61._8_4_ = auVar38._8_4_ + fStack_140 * 0.0;
    auVar61._12_4_ = auVar38._12_4_ + fStack_13c * 0.0;
    auVar51 = vmovshdup_avx(auVar61);
    auVar38._0_4_ = auVar35._0_4_ + (float)local_148._0_4_ * (float)(undefined4)uVar14;
    auVar38._4_4_ = auVar35._4_4_ + (float)local_148._4_4_ * (float)uVar14._4_4_;
    auVar38._8_4_ = auVar35._8_4_ + fStack_140 * 0.0;
    auVar38._12_4_ = auVar35._12_4_ + fStack_13c * 0.0;
    auVar35 = vmovshdup_avx(auVar38);
    auVar38 = vmulss_avx512f(local_188,auVar35);
    fVar5 = auVar38._0_4_ + auVar51._0_4_ * (float)local_148._0_4_;
    auVar63 = ZEXT416((uint)pNVar26[piVar23[local_170]].super_Tuple3<pbrt::Normal3,_float>.z);
    auVar38 = vinsertps_avx512f(auVar63,auVar67,0x1c);
    auVar75._0_4_ = (float)local_f8._0_4_ * auVar38._0_4_ + (float)local_e8._0_4_ * auVar39._0_4_;
    auVar75._4_4_ = (float)local_f8._4_4_ * auVar38._4_4_ + (float)local_e8._4_4_ * auVar39._4_4_;
    auVar75._8_4_ = fStack_f0 * auVar38._8_4_ + fStack_e0 * auVar39._8_4_;
    auVar75._12_4_ = fStack_ec * auVar38._12_4_ + fStack_dc * auVar39._12_4_;
    auVar36 = ZEXT416((uint)pNVar26[piVar23[local_170 + 1]].super_Tuple3<pbrt::Normal3,_float>.z);
    auVar39 = vinsertps_avx(auVar36,auVar65,0x1c);
    auVar37 = ZEXT416((uint)pNVar26[piVar23[local_170 + 3]].super_Tuple3<pbrt::Normal3,_float>.z);
    auVar38 = vinsertps_avx(auVar37,auVar68,0x1c);
    auVar77._0_4_ = (float)local_f8._0_4_ * auVar39._0_4_ + (float)local_e8._0_4_ * auVar38._0_4_;
    auVar77._4_4_ = (float)local_f8._4_4_ * auVar39._4_4_ + (float)local_e8._4_4_ * auVar38._4_4_;
    auVar77._8_4_ = fStack_f0 * auVar39._8_4_ + fStack_e0 * auVar38._8_4_;
    auVar77._12_4_ = fStack_ec * auVar39._12_4_ + fStack_dc * auVar38._12_4_;
    auVar39 = vmulps_avx512vl(local_198,auVar75);
    auVar38 = vmulps_avx512vl(local_1a8,auVar77);
    auVar78._0_4_ = auVar39._0_4_ + auVar38._0_4_;
    auVar78._4_4_ = auVar39._4_4_ + auVar38._4_4_;
    auVar78._8_4_ = auVar39._8_4_ + auVar38._8_4_;
    auVar78._12_4_ = auVar39._12_4_ + auVar38._12_4_;
    auVar86._0_4_ = auVar78._0_4_ * auVar78._0_4_;
    auVar86._4_4_ = auVar78._4_4_ * auVar78._4_4_;
    auVar86._8_4_ = auVar78._8_4_ * auVar78._8_4_;
    auVar86._12_4_ = auVar78._12_4_ * auVar78._12_4_;
    auVar39 = vmovshdup_avx512vl(auVar86);
    auVar39 = vaddss_avx512f(auVar39,ZEXT416((uint)(fVar5 * fVar5)));
    fVar6 = auVar39._0_4_ + auVar86._0_4_;
    if (0.0 < fVar6) {
      auVar39 = vsqrtss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      local_1d8 = vdivss_avx512f(ZEXT416((uint)fVar5),auVar39);
      auVar82._0_4_ = auVar39._0_4_;
      auVar82._4_4_ = auVar82._0_4_;
      auVar82._8_4_ = auVar82._0_4_;
      auVar82._12_4_ = auVar82._0_4_;
      fVar5 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
      auVar53 = vdivps_avx512vl(auVar78,auVar82);
      uVar15._0_4_ = (__return_storage_ptr__->super_Interaction).n.
                     super_Tuple3<pbrt::Normal3,_float>.y;
      uVar15._4_4_ = (__return_storage_ptr__->super_Interaction).n.
                     super_Tuple3<pbrt::Normal3,_float>.z;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar15;
      auVar83._0_4_ = (float)(undefined4)uVar15 * (float)(undefined4)uVar15;
      auVar83._4_4_ = (float)uVar15._4_4_ * (float)uVar15._4_4_;
      auVar83._8_8_ = 0;
      auVar39 = vmovshdup_avx(auVar83);
      local_1c8 = vmovshdup_avx512vl(auVar53);
      auVar39 = ZEXT416((uint)(fVar5 * fVar5 + auVar83._0_4_ + auVar39._0_4_));
      auVar39 = vsqrtss_avx(auVar39,auVar39);
      auVar84._0_4_ = auVar39._0_4_;
      auVar62._0_4_ = fVar5 / auVar84._0_4_;
      auVar62._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar84._4_4_ = auVar84._0_4_;
      auVar84._8_4_ = auVar84._0_4_;
      auVar84._12_4_ = auVar84._0_4_;
      auVar39 = vdivps_avx(auVar79,auVar84);
      auVar38 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar53,local_1d8);
      auVar54 = vpermt2ps_avx512vl(auVar39,_DAT_00447c50,auVar62);
      auVar55 = vmulps_avx512vl(auVar38,auVar54);
      auVar56 = vfmsub213ps_avx512vl(auVar53,auVar39,auVar55);
      auVar38 = vfnmadd213ps_avx512vl(auVar54,auVar38,auVar55);
      auVar54 = vaddps_avx512vl(auVar56,auVar38);
      auVar38 = vmulss_avx512f(local_1c8,auVar39);
      auVar55 = vfmsub213ss_avx512f(local_1d8,auVar62,auVar38);
      auVar56 = vfnmadd231ss_avx512f(auVar38,auVar39,local_1c8);
      auVar58._0_4_ = auVar54._0_4_ * auVar54._0_4_;
      auVar58._4_4_ = auVar54._4_4_ * auVar54._4_4_;
      auVar58._8_4_ = auVar54._8_4_ * auVar54._8_4_;
      auVar58._12_4_ = auVar54._12_4_ * auVar54._12_4_;
      auVar38 = vhaddps_avx(auVar58,auVar58);
      auVar55 = vaddss_avx512f(auVar55,auVar56);
      auVar56 = vmulss_avx512f(auVar55,auVar55);
      vaddss_avx512f(auVar56,auVar38);
      auVar38 = vucomiss_avx512f(ZEXT416(0x283424dc));
      if (0.0 < fVar6) {
        local_1b8 = vsubps_avx(auVar77,auVar75);
        auVar56 = vmulps_avx512vl(local_1a8,auVar68);
        auVar40 = vmulps_avx512vl(local_198,auVar67);
        auVar41 = vmulps_avx512vl(local_1a8,auVar65);
        auVar37 = vmulss_avx512f(local_188,auVar37);
        auVar66._0_4_ = auVar40._0_4_ + auVar41._0_4_;
        auVar66._4_4_ = auVar40._4_4_ + auVar41._4_4_;
        auVar66._8_4_ = auVar40._8_4_ + auVar41._8_4_;
        auVar66._12_4_ = auVar40._12_4_ + auVar41._12_4_;
        _local_208 = ZEXT416((uint)(auVar35._0_4_ - auVar51._0_4_));
        auVar51 = vmulps_avx512vl(local_198,auVar69);
        auVar59._0_4_ = auVar51._0_4_ + auVar56._0_4_;
        auVar59._4_4_ = auVar51._4_4_ + auVar56._4_4_;
        auVar59._8_4_ = auVar51._8_4_ + auVar56._8_4_;
        auVar59._12_4_ = auVar51._12_4_ + auVar56._12_4_;
        local_198 = vsubps_avx(auVar59,auVar66);
        auVar51 = vmulss_avx512f(_local_148,auVar63);
        auVar35 = vmulss_avx512f(local_188,auVar36);
        local_188._0_4_ =
             ((float)local_148._0_4_ * fVar57 + auVar37._0_4_) - (auVar51._0_4_ + auVar35._0_4_);
        auVar38 = vsqrtss_avx512f(auVar38,auVar38);
        fVar57 = auVar38._0_4_;
        auVar64._4_4_ = fVar57;
        auVar64._0_4_ = fVar57;
        auVar64._8_4_ = fVar57;
        auVar64._12_4_ = fVar57;
        axis.super_Tuple3<pbrt::Vector3,_float>.z = auVar55._0_4_ / fVar57;
        auVar51 = vmovshdup_avx(auVar39);
        auVar35 = vmulss_avx512f(auVar53,auVar51);
        auVar38 = vdivps_avx(auVar54,auVar64);
        auVar39 = vfmadd213ss_fma(local_1d8,auVar39,auVar35);
        auVar51 = vfmsub213ss_avx512f(auVar51,auVar53,auVar35);
        auVar51 = vfmadd213ss_avx512f(auVar62,local_1c8,
                                      ZEXT416((uint)(auVar39._0_4_ + auVar51._0_4_)));
        auVar39 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar51,auVar51);
        auVar39 = vmaxss_avx(auVar39,ZEXT816(0) << 0x20);
        auVar39 = vsqrtss_avx(auVar39,auVar39);
        axis.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar38._0_8_;
        local_1a8 = auVar53;
        Rotate((Transform *)&vb,auVar39._0_4_,auVar51._0_4_,axis);
        auVar39 = vfmadd231ss_fma(ZEXT416((uint)((float)local_118._0_4_ * vb._4_4_)),
                                  ZEXT416(vb._0_4_),local_1e8);
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)((float)local_118._0_4_ * local_b4)),
                                  ZEXT416((uint)local_b8),local_1e8);
        auVar51 = vfmadd231ss_fma(ZEXT416((uint)((float)local_118._0_4_ * local_a4)),
                                  ZEXT416((uint)local_a8),local_1e8);
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)((float)local_108._0_4_ * vb._4_4_)),local_1f8,
                                  ZEXT416(vb._0_4_));
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)((float)local_108._0_4_ * local_b4)),local_1f8,
                                  ZEXT416((uint)local_b8));
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)((float)local_108._0_4_ * local_a4)),
                                  ZEXT416((uint)local_a8),local_1f8);
        auVar63 = vfmadd231ss_fma(auVar39,ZEXT416((uint)local_c0),local_138);
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)local_b0),local_138);
        auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)local_a0),local_138);
        auVar39 = vfmadd231ss_fma(auVar35,local_128,ZEXT416((uint)local_c0));
        auVar35 = vfmadd231ss_fma(auVar36,local_128,ZEXT416((uint)local_b0));
        auVar36 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_a0),local_128);
        auVar39 = vinsertps_avx(auVar39,auVar35,0x10);
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(local_1d8._0_4_ * auVar38._0_4_)),auVar63,local_1c8
                                 );
        auVar35 = vfmadd231ss_fma(auVar35,auVar51,local_1a8);
        fVar57 = auVar35._0_4_;
        ns.super_Tuple3<pbrt::Normal3,_float>.z = local_1a8._0_4_;
        auVar38 = vinsertps_avx(ZEXT416((uint)(auVar63._0_4_ - local_1c8._0_4_ * fVar57)),
                                ZEXT416((uint)(auVar38._0_4_ - local_1d8._0_4_ * fVar57)),0x10);
        local_218 = vmovlps_avx(local_198);
        auVar35 = vpermt2ps_avx512vl(local_1b8,_DAT_00447c50,_local_208);
        local_210 = (float)local_188._0_4_;
        auVar37 = vpermt2ps_avx512vl(local_1a8,_DAT_00447c50,local_1d8);
        dndvs.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_188._0_4_;
        dndvs.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_218;
        dndvs.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)local_218 >> 0x20);
        dpdus.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar38._0_8_;
        dpdus.super_Tuple3<pbrt::Vector3,_float>.z =
             auVar51._0_4_ - ns.super_Tuple3<pbrt::Normal3,_float>.z * fVar57;
        ns.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar37._0_8_;
        dpdvs.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar39._0_8_;
        dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = auVar36._0_4_;
        dndus.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar35._0_8_;
        dndus.super_Tuple3<pbrt::Normal3,_float>.z = local_1b8._0_4_;
        SurfaceInteraction::SetShadingGeometry
                  (__return_storage_ptr__,ns,dpdus,dpdvs,dndus,dndvs,true);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const BilinearPatchMesh *mesh,
                                                          int patchIndex, Point2f uv,
                                                          Float time,
                                                          const Vector3f &wo) {
        // Compute bilinear patch intersection point, $\dpdu$, and $\dpdv$
        const int *v = &mesh->vertexIndices[4 * patchIndex];
        Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]], p01 = mesh->p[v[2]],
                p11 = mesh->p[v[3]];
        Point3f pHit = Lerp(uv[0], Lerp(uv[1], p00, p01), Lerp(uv[1], p10, p11));
        Vector3f dpdu = Lerp(uv[1], p10, p11) - Lerp(uv[1], p00, p01);
        Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);

        Point2f uvTex = uv;
        if (mesh->uv != nullptr) {
            // Compute texture coordinates for bilinear patch intersection point
            const Point2f &uv00 = mesh->uv[v[0]], &uv10 = mesh->uv[v[1]];
            const Point2f &uv01 = mesh->uv[v[2]], &uv11 = mesh->uv[v[3]];
            uvTex = Lerp(uv[0], Lerp(uv[1], uv00, uv01), Lerp(uv[1], uv10, uv11));
            // Update bilinear patch $\dpdu$ and $\dpdv$ accounting for texture
            // coordinates Compute partial derivatives of $(u,v)$ with respect to
            // interpolated texture coordinates
            Float dsdu =
                -uv00[0] + uv10[0] + uv[1] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dsdv =
                -uv00[0] + uv01[0] + uv[0] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dtdu =
                -uv00[1] + uv10[1] + uv[1] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float dtdv =
                -uv00[1] + uv01[1] + uv[0] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float duds = std::abs(dsdu) < 1e-8f ? 0 : 1 / dsdu;
            Float dvds = std::abs(dsdv) < 1e-8f ? 0 : 1 / dsdv;
            Float dudt = std::abs(dtdu) < 1e-8f ? 0 : 1 / dtdu;
            Float dvdt = std::abs(dtdv) < 1e-8f ? 0 : 1 / dtdv;

            // Compute partial derivatives of $\pt{}$ with respect to interpolated texture
            // coordinates
            Vector3f dpds = dpdu * duds + dpdv * dvds;
            Vector3f dpdt = dpdu * dudt + dpdv * dvdt;

            // Set _dpdu_ and _dpdt_ to updated partial derivatives
            if (Cross(dpds, dpdt) != Vector3f(0, 0, 0)) {
                if (Dot(Cross(dpdu, dpdv), Cross(dpds, dpdt)) < 0)
                    dpdt = -dpdt;
                CHECK_GE(Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt))),
                         -1e-3);
                dpdu = dpds;
                dpdv = dpdt;
            }
        }
        // Find partial derivatives $\dndu$ and $\dndv$ for bilinear patch
        Vector3f d2Pduu(0, 0, 0), d2Pdvv(0, 0, 0);
        Vector3f d2Pduv(p00.x - p01.x - p10.x + p11.x, p00.y - p01.y - p10.y + p11.y,
                        p00.z - p01.z - p10.z + p11.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Initialize bilinear patch intersection point error _pError_
        Vector3f pError =
            gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

        // Initialize _SurfaceInteraction_ for bilinear patch intersection
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[patchIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        SurfaceInteraction isect(Point3fi(pHit, pError), uvTex, wo, dpdu, dpdv, dndu,
                                 dndv, time, flipNormal, faceIndex);

        if (mesh->n != nullptr) {
            // Compute shading normals for bilinear patch intersection point
            Normal3f n00 = mesh->n[v[0]], n10 = mesh->n[v[1]], n01 = mesh->n[v[2]],
                     n11 = mesh->n[v[3]];
            Normal3f ns = Lerp(uv[0], Lerp(uv[1], n00, n01), Lerp(uv[1], n10, n11));
            if (LengthSquared(ns) > 0) {
                ns = Normalize(ns);
                Normal3f n = Normal3f(Normalize(isect.n));
                Vector3f axis = Cross(Vector3f(n), Vector3f(ns));
                if (LengthSquared(axis) > 1e-14f) {
                    // Set shading geometry for bilinear patch intersection
                    Normal3f dndu = Lerp(uv[1], n10, n11) - Lerp(uv[1], n00, n01);
                    Normal3f dndv = Lerp(uv[0], n01, n11) - Lerp(uv[0], n00, n10);
                    axis = Normalize(axis);
                    Float cosTheta = Dot(n, ns),
                          sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
                    Transform r = Rotate(sinTheta, cosTheta, axis);
                    Vector3f sdpdu = r(dpdu), sdpdv = r(dpdv);
                    sdpdu = GramSchmidt(sdpdu, Vector3f(ns));
                    isect.SetShadingGeometry(ns, sdpdu, sdpdv, dndu, dndv, true);
                }
            }
        }
        return isect;
    }